

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall
QTreeModel::sortItems(QTreeModel *this,QList<QTreeWidgetItem_*> *items,int column,SortOrder order)

{
  QTreeWidgetItem *pQVar1;
  parameter_type t;
  bool bVar2;
  uint uVar3;
  pointer ppVar4;
  iterator __first;
  iterator __last;
  int i;
  undefined1 *puVar5;
  code *__comp;
  undefined1 *i_00;
  int c;
  int iVar6;
  long lVar7;
  long in_FS_OFFSET;
  QModelIndex local_c8;
  QModelIndex local_b0;
  QArrayDataPointer<QModelIndex> local_98;
  QArrayDataPointer<QModelIndex> local_78;
  QArrayDataPointer<std::pair<QTreeWidgetItem_*,_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)&this->field_0x8 + 0x88) == 0) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (pair<QTreeWidgetItem_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    QList<std::pair<QTreeWidgetItem_*,_int>_>::QList
              ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)&local_58,(items->d).size);
    lVar7 = 0;
    for (puVar5 = (undefined1 *)0x0; puVar5 < (ulong)local_58.size; puVar5 = puVar5 + 1) {
      pQVar1 = (items->d).ptr[(long)puVar5];
      ppVar4 = QList<std::pair<QTreeWidgetItem_*,_int>_>::data
                         ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)&local_58);
      *(QTreeWidgetItem **)((long)&ppVar4->first + lVar7) = pQVar1;
      ppVar4 = QList<std::pair<QTreeWidgetItem_*,_int>_>::data
                         ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)&local_58);
      *(int *)((long)&ppVar4->second + lVar7) = (int)puVar5;
      lVar7 = lVar7 + 0x10;
    }
    __comp = itemGreaterThan;
    if (order == AscendingOrder) {
      __comp = itemLessThan;
    }
    __first = QList<std::pair<QTreeWidgetItem_*,_int>_>::begin
                        ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)&local_58);
    __last = QList<std::pair<QTreeWidgetItem_*,_int>_>::end
                       ((QList<std::pair<QTreeWidgetItem_*,_int>_> *)&local_58);
    std::
    __stable_sort<QList<std::pair<QTreeWidgetItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTreeWidgetItem*,int>const&,std::pair<QTreeWidgetItem*,int>const&)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(const_std::pair<QTreeWidgetItem_*,_int>_&,_const_std::pair<QTreeWidgetItem_*,_int>_&)>
                )__comp);
    local_78.size = 0;
    local_98.size = 0;
    local_b0.r = -1;
    local_b0.c = -1;
    local_78.d = (Data *)0x0;
    local_78.ptr = (QModelIndex *)0x0;
    local_98.d = (Data *)0x0;
    local_98.ptr = (QModelIndex *)0x0;
    local_b0.i = 0;
    local_b0.m.ptr = (QAbstractItemModel *)0x0;
    uVar3 = (**(code **)(*(long *)this + 0x80))(this);
    i_00 = (undefined1 *)0x0;
    puVar5 = (undefined1 *)(ulong)uVar3;
    if ((int)uVar3 < 1) {
      puVar5 = i_00;
    }
    for (; i_00 < (ulong)local_58.size; i_00 = i_00 + 1) {
      uVar3 = local_58.ptr[(long)i_00].second;
      if (i_00 != (undefined1 *)(ulong)uVar3) {
        t = local_58.ptr[(long)i_00].first;
        QList<QTreeWidgetItem_*>::replace(items,(qsizetype)i_00,t);
        for (iVar6 = 0; (int)puVar5 != iVar6; iVar6 = iVar6 + 1) {
          local_b0.c = iVar6;
          local_b0.r = uVar3;
          local_c8.r = uVar3;
          local_c8.c = iVar6;
          local_c8.i = (quintptr)t;
          local_c8.m.ptr = &this->super_QAbstractItemModel;
          local_b0.i = (quintptr)t;
          local_b0.m.ptr = &this->super_QAbstractItemModel;
          bVar2 = QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::contains
                            ((QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>
                              *)(*(long *)&this->field_0x8 + 0x90),(QModelIndexWrapper *)&local_c8);
          if (bVar2) {
            local_c8.r = (int)i_00;
            local_c8.c = iVar6;
            local_c8.i = (quintptr)t;
            local_c8.m.ptr = &this->super_QAbstractItemModel;
            QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                      ((QList<QModelIndex> *)&local_78,&local_b0);
            QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                      ((QList<QModelIndex> *)&local_98,&local_c8);
          }
        }
      }
    }
    QAbstractItemModel::changePersistentIndexList
              ((QList_conflict *)this,(QList_conflict *)&local_78);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<std::pair<QTreeWidgetItem_*,_int>_>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeModel::sortItems(QList<QTreeWidgetItem*> *items, int column, Qt::SortOrder order)
{
    // see QTreeViewItem::operator<
    Q_UNUSED(column);
    if (isChanging())
        return;

    // store the original order of indexes
    QList<std::pair<QTreeWidgetItem *, int>> sorting(items->size());
    for (int i = 0; i < sorting.size(); ++i) {
        sorting[i].first = items->at(i);
        sorting[i].second = i;
    }

    // do the sorting
    const auto compare = (order == Qt::AscendingOrder ? &itemLessThan : &itemGreaterThan);
    std::stable_sort(sorting.begin(), sorting.end(), compare);

    QModelIndexList fromList;
    QModelIndexList toList;
    int colCount = columnCount();
    for (int r = 0; r < sorting.size(); ++r) {
        int oldRow = sorting.at(r).second;
        if (oldRow == r)
            continue;
        QTreeWidgetItem *item = sorting.at(r).first;
        items->replace(r, item);
        for (int c = 0; c < colCount; ++c) {
            QModelIndex from = createIndex(oldRow, c, item);
            if (static_cast<QAbstractItemModelPrivate *>(d_ptr.data())->persistent.indexes.contains(from)) {
                QModelIndex to = createIndex(r, c, item);
                fromList << from;
                toList << to;
            }
        }
    }
    changePersistentIndexList(fromList, toList);
}